

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derTUINTDec(octet *val,size_t *len,octet *der,size_t count,u32 tag)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  size_t l;
  octet *v;
  
  sVar1 = derDec2(&v,&l,der,count,tag);
  sVar2 = 0xffffffffffffffff;
  if (((sVar1 != 0xffffffffffffffff) && (l != 0)) && (-1 < (char)*v)) {
    if (l == 1 || *v != '\0') {
      uVar3 = 0;
    }
    else {
      if (-1 < (char)v[1]) {
        return 0xffffffffffffffff;
      }
      uVar3 = (ulong)(v[1] >> 7);
    }
    if (val != (octet *)0x0) {
      memMove(val,v + uVar3,l - uVar3);
      memRev(val,l - uVar3);
    }
    sVar2 = sVar1;
    if (len != (size_t *)0x0) {
      *len = l - uVar3;
    }
  }
  return sVar2;
}

Assistant:

size_t derTUINTDec(octet* val, size_t* len, const octet der[], size_t count,
	u32 tag)
{
	const octet* v;
	size_t l;
	size_t ex;
	// декодировать
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// в значении менее одного октета?
	// установлен старший бит в первом (старшем) октете?
	// незначащий нулевой октет?
	if (l < 1 || (v[0] & 128) ||
		v[0] == 0 && l > 1 && !(v[1] & 128))
		return SIZE_MAX;
	// дополнительный нулевой октет?
	ex = (v[0] == 0 && l > 1 && (v[1] & 128)) ? 1 : 0;
	// возвратить значение
	if (val)
	{
		ASSERT(memIsValid(val, l - ex));
		ASSERT(len == 0 || memIsDisjoint2(len, O_PER_S, val, l - ex));
		memMove(val, v + ex, l - ex);
		memRev(val, l - ex);
	}
	// возвратить длину
	if (len)
	{
		ASSERT(memIsValid(len, O_PER_S));
		*len = l - ex;
	}
	return count;
}